

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_obj.c
# Opt level: O1

bool is_carrying(CHAR_DATA *ch,int vnum)

{
  OBJ_DATA *pOVar1;
  OBJ_DATA *pOVar2;
  bool bVar3;
  
  pOVar1 = ch->carrying;
  while ((bVar3 = pOVar1 != (OBJ_DATA *)0x0, bVar3 && (pOVar1->pIndexData->vnum != vnum))) {
    for (pOVar2 = pOVar1->contains; pOVar2 != (OBJ_DATA *)0x0; pOVar2 = pOVar2->next_content) {
      if (pOVar2->pIndexData->vnum == vnum) {
        return bVar3;
      }
    }
    pOVar1 = pOVar1->next_content;
  }
  return bVar3;
}

Assistant:

bool is_carrying(CHAR_DATA *ch, int vnum)
{
	OBJ_DATA *obj, *cont;

	for (obj = ch->carrying; obj; obj = obj->next_content)
	{
		if (obj->pIndexData->vnum == vnum)
			return true;

		for (cont = obj->contains; cont; cont = cont->next_content)
		{
			if (cont->pIndexData->vnum == vnum)
				return true;
		}
	}

	return false;
}